

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void srclistRenumberCursors(Parse *pParse,int *aCsrMap,SrcList *pSrc,int iExcept)

{
  int iVar1;
  Select *pSVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  SrcItem *pSVar6;
  Subquery *pSVar7;
  
  pSVar6 = pSrc->a;
  for (iVar5 = 0; iVar5 < pSrc->nSrc; iVar5 = iVar5 + 1) {
    if (iVar5 != iExcept) {
      uVar3 = *(ushort *)&(pSVar6->fg).field_0x1;
      iVar1 = pSVar6->iCursor;
      if ((-1 < (char)uVar3) || (iVar4 = aCsrMap[(long)iVar1 + 1], iVar4 == 0)) {
        iVar4 = pParse->nTab;
        pParse->nTab = iVar4 + 1;
        aCsrMap[(long)iVar1 + 1] = iVar4;
        iVar4 = aCsrMap[(long)pSVar6->iCursor + 1];
        uVar3 = *(ushort *)&(pSVar6->fg).field_0x1;
      }
      pSVar6->iCursor = iVar4;
      if ((uVar3 & 4) != 0) {
        pSVar7 = (pSVar6->u4).pSubq;
        while (pSVar2 = pSVar7->pSelect, pSVar2 != (Select *)0x0) {
          srclistRenumberCursors(pParse,aCsrMap,pSVar2->pSrc,-1);
          pSVar7 = (Subquery *)&pSVar2->pPrior;
        }
      }
    }
    pSVar6 = pSVar6 + 1;
  }
  return;
}

Assistant:

static void srclistRenumberCursors(
  Parse *pParse,                  /* Parse context */
  int *aCsrMap,                   /* Array to store cursor mappings in */
  SrcList *pSrc,                  /* FROM clause to renumber */
  int iExcept                     /* FROM clause item to skip */
){
  int i;
  SrcItem *pItem;
  for(i=0, pItem=pSrc->a; i<pSrc->nSrc; i++, pItem++){
    if( i!=iExcept ){
      Select *p;
      assert( pItem->iCursor < aCsrMap[0] );
      if( !pItem->fg.isRecursive || aCsrMap[pItem->iCursor+1]==0 ){
        aCsrMap[pItem->iCursor+1] = pParse->nTab++;
      }
      pItem->iCursor = aCsrMap[pItem->iCursor+1];
      if( pItem->fg.isSubquery ){
        for(p=pItem->u4.pSubq->pSelect; p; p=p->pPrior){
          srclistRenumberCursors(pParse, aCsrMap, p->pSrc, -1);
        }
      }
    }
  }
}